

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O0

void __thiscall
JetHead::vector<Regex::GroupData>::sizeup(vector<Regex::GroupData> *this,uint newSize)

{
  GroupData *pGVar1;
  uint local_24;
  uint i;
  GroupData *temp;
  uint newSize_local;
  vector<Regex::GroupData> *this_local;
  
  temp._4_4_ = newSize;
  if (newSize == 0) {
    if (this->mAllocated == 0) {
      temp._4_4_ = 0x20;
    }
    else {
      temp._4_4_ = this->mAllocated << 1;
    }
  }
  pGVar1 = (GroupData *)operator_new__((ulong)temp._4_4_ * 0x28);
  if (this->mData != (GroupData *)0x0) {
    for (local_24 = 0; local_24 < this->mSize; local_24 = local_24 + 1) {
      Regex::GroupData::GroupData(pGVar1 + local_24,this->mData + local_24);
      Regex::GroupData::~GroupData(this->mData + local_24);
    }
    if (this->mData != (GroupData *)0x0) {
      operator_delete__(this->mData);
    }
  }
  this->mData = pGVar1;
  this->mAllocated = temp._4_4_;
  return;
}

Assistant:

void sizeup(unsigned newSize=0)
		{
			// No size was specified, double the existing size.
			// Doubling a self-expanding array means that storing O(n) 
			// elements takes O(n lg n) worst case.  Adding only a 
			// constant number of elements makes that O(n^2).
			if (newSize == 0) 
			{
				// If we allocated ANYTHING yet, then double it, if 
				// not just use the default size.
				if (mAllocated)
				{
					newSize = mAllocated * 2;
				} else {
					newSize = DEFAULT_ALLOCATION;
				}
			}

			// A new buffer
			T* temp = (T*)(new uint8_t[sizeof(T) * newSize]);

			// If we had data, copy it over
			if (mData)
			{
				// Move all of my data into the new buffer (copy then delete)
				for (unsigned i = 0; i < mSize; i++)
				{
					new(temp + i) T(mData[i]);
					mData[i].~T();
				}
				
				// Delete old buffer
				delete[] (uint8_t*)mData;
			}
			
			// Keep new buffer
			mData = temp;

			// Remember new allocation size
			mAllocated = newSize;
		}